

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zipkincore_types.cpp
# Opt level: O1

void __thiscall twitter::zipkin::thrift::Span::printTo(Span *this,ostream *out)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _Span__isset _Var2;
  uint uVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *t;
  string local_c8;
  string local_a8;
  string local_88;
  string local_68;
  string local_48;
  
  std::__ostream_insert<char,std::char_traits<char>>(out,"Span(",5);
  std::__ostream_insert<char,std::char_traits<char>>(out,"trace_id=",9);
  apache::thrift::to_string<long>(&local_c8,&this->trace_id);
  std::__ostream_insert<char,std::char_traits<char>>
            (out,local_c8._M_dataplus._M_p,local_c8._M_string_length);
  paVar1 = &local_c8.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != paVar1) {
    operator_delete(local_c8._M_dataplus._M_p);
  }
  std::__ostream_insert<char,std::char_traits<char>>(out,", ",2);
  std::__ostream_insert<char,std::char_traits<char>>(out,"name=",5);
  apache::thrift::to_string<std::__cxx11::string>(&local_c8,(thrift *)&this->name,t);
  std::__ostream_insert<char,std::char_traits<char>>
            (out,local_c8._M_dataplus._M_p,local_c8._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != paVar1) {
    operator_delete(local_c8._M_dataplus._M_p);
  }
  std::__ostream_insert<char,std::char_traits<char>>(out,", ",2);
  std::__ostream_insert<char,std::char_traits<char>>(out,"id=",3);
  apache::thrift::to_string<long>(&local_c8,&this->id);
  std::__ostream_insert<char,std::char_traits<char>>
            (out,local_c8._M_dataplus._M_p,local_c8._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != paVar1) {
    operator_delete(local_c8._M_dataplus._M_p);
  }
  std::__ostream_insert<char,std::char_traits<char>>(out,", ",2);
  std::__ostream_insert<char,std::char_traits<char>>(out,"parent_id=",10);
  _Var2 = this->__isset;
  if (((ushort)_Var2 & 8) == 0) {
    std::__ostream_insert<char,std::char_traits<char>>(out,"<null>",6);
  }
  else {
    apache::thrift::to_string<long>(&local_c8,&this->parent_id);
    std::__ostream_insert<char,std::char_traits<char>>
              (out,local_c8._M_dataplus._M_p,local_c8._M_string_length);
  }
  if ((((ushort)_Var2 & 8) != 0) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != paVar1)) {
    operator_delete(local_c8._M_dataplus._M_p);
  }
  std::__ostream_insert<char,std::char_traits<char>>(out,", ",2);
  std::__ostream_insert<char,std::char_traits<char>>(out,"annotations=",0xc);
  apache::thrift::to_string<twitter::zipkin::thrift::Annotation>(&local_a8,&this->annotations);
  std::__ostream_insert<char,std::char_traits<char>>
            (out,local_a8._M_dataplus._M_p,local_a8._M_string_length);
  paVar1 = &local_a8.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != paVar1) {
    operator_delete(local_a8._M_dataplus._M_p);
  }
  std::__ostream_insert<char,std::char_traits<char>>(out,", ",2);
  std::__ostream_insert<char,std::char_traits<char>>(out,"binary_annotations=",0x13);
  apache::thrift::to_string<twitter::zipkin::thrift::BinaryAnnotation>
            (&local_a8,&this->binary_annotations);
  std::__ostream_insert<char,std::char_traits<char>>
            (out,local_a8._M_dataplus._M_p,local_a8._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != paVar1) {
    operator_delete(local_a8._M_dataplus._M_p);
  }
  std::__ostream_insert<char,std::char_traits<char>>(out,", ",2);
  std::__ostream_insert<char,std::char_traits<char>>(out,"debug=",6);
  _Var2 = this->__isset;
  if (((ushort)_Var2 & 0x40) == 0) {
    std::__ostream_insert<char,std::char_traits<char>>(out,"<null>",6);
  }
  else {
    apache::thrift::to_string<bool>(&local_a8,&this->debug);
    std::__ostream_insert<char,std::char_traits<char>>
              (out,local_a8._M_dataplus._M_p,local_a8._M_string_length);
  }
  if ((((ushort)_Var2 & 0x40) != 0) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != paVar1)) {
    operator_delete(local_a8._M_dataplus._M_p);
  }
  std::__ostream_insert<char,std::char_traits<char>>(out,", ",2);
  std::__ostream_insert<char,std::char_traits<char>>(out,"timestamp=",10);
  if (SUB21(this->__isset,0) < '\0') {
    apache::thrift::to_string<long>(&local_48,&this->timestamp);
    std::__ostream_insert<char,std::char_traits<char>>
              (out,local_48._M_dataplus._M_p,local_48._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p);
    }
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>(out,"<null>",6);
  }
  std::__ostream_insert<char,std::char_traits<char>>(out,", ",2);
  std::__ostream_insert<char,std::char_traits<char>>(out,"duration=",9);
  uVar3 = *(uint *)&this->__isset;
  if ((uVar3 >> 8 & 1) == 0) {
    std::__ostream_insert<char,std::char_traits<char>>(out,"<null>",6);
  }
  else {
    apache::thrift::to_string<long>(&local_68,&this->duration);
    std::__ostream_insert<char,std::char_traits<char>>
              (out,local_68._M_dataplus._M_p,local_68._M_string_length);
  }
  if (((uVar3 >> 8 & 1) != 0) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2)) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  std::__ostream_insert<char,std::char_traits<char>>(out,", ",2);
  std::__ostream_insert<char,std::char_traits<char>>(out,"trace_id_high=",0xe);
  uVar3 = *(uint *)&this->__isset;
  if ((uVar3 >> 9 & 1) == 0) {
    std::__ostream_insert<char,std::char_traits<char>>(out,"<null>",6);
  }
  else {
    apache::thrift::to_string<long>(&local_88,&this->trace_id_high);
    std::__ostream_insert<char,std::char_traits<char>>
              (out,local_88._M_dataplus._M_p,local_88._M_string_length);
  }
  if (((uVar3 >> 9 & 1) != 0) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2)) {
    operator_delete(local_88._M_dataplus._M_p);
  }
  std::__ostream_insert<char,std::char_traits<char>>(out,")",1);
  return;
}

Assistant:

void Span::printTo(std::ostream& out) const {
  using ::apache::thrift::to_string;
  out << "Span(";
  out << "trace_id=" << to_string(trace_id);
  out << ", " << "name=" << to_string(name);
  out << ", " << "id=" << to_string(id);
  out << ", " << "parent_id="; (__isset.parent_id ? (out << to_string(parent_id)) : (out << "<null>"));
  out << ", " << "annotations=" << to_string(annotations);
  out << ", " << "binary_annotations=" << to_string(binary_annotations);
  out << ", " << "debug="; (__isset.debug ? (out << to_string(debug)) : (out << "<null>"));
  out << ", " << "timestamp="; (__isset.timestamp ? (out << to_string(timestamp)) : (out << "<null>"));
  out << ", " << "duration="; (__isset.duration ? (out << to_string(duration)) : (out << "<null>"));
  out << ", " << "trace_id_high="; (__isset.trace_id_high ? (out << to_string(trace_id_high)) : (out << "<null>"));
  out << ")";
}